

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipkinCollector.cpp
# Opt level: O0

ssize_t __thiscall
twitter::zipkin::thrift::ZipkinCollector_submitZipkinBatch_pargs::write
          (ZipkinCollector_submitZipkinBatch_pargs *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  size_type sVar5;
  reference pSVar6;
  undefined4 in_register_00000034;
  TProtocol *prot;
  __normal_iterator<const_twitter::zipkin::thrift::Span_*,_std::vector<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_>_>
  local_50;
  Span *local_48;
  __normal_iterator<const_twitter::zipkin::thrift::Span_*,_std::vector<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_>_>
  local_40;
  const_iterator _iter29;
  TOutputRecursionTracker local_28;
  TOutputRecursionTracker tracker;
  uint32_t xfer;
  TProtocol *oprot_local;
  ZipkinCollector_submitZipkinBatch_pargs *this_local;
  
  prot = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  tracker.prot_._4_4_ = 0;
  apache::thrift::protocol::TOutputRecursionTracker::TOutputRecursionTracker(&local_28,prot);
  uVar2 = apache::thrift::protocol::TProtocol::writeStructBegin
                    (prot,"ZipkinCollector_submitZipkinBatch_pargs");
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar2;
  uVar2 = apache::thrift::protocol::TProtocol::writeFieldBegin(prot,"spans",T_LIST,1);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar2;
  sVar5 = std::vector<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_>
          ::size(this->spans);
  uVar2 = apache::thrift::protocol::TProtocol::writeListBegin(prot,T_STRUCT,(uint32_t)sVar5);
  tracker.prot_._4_4_ = uVar2 + tracker.prot_._4_4_;
  __gnu_cxx::
  __normal_iterator<const_twitter::zipkin::thrift::Span_*,_std::vector<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_>_>
  ::__normal_iterator(&local_40);
  local_48 = (Span *)std::
                     vector<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_>
                     ::begin(this->spans);
  local_40._M_current = local_48;
  while( true ) {
    local_50._M_current =
         (Span *)std::
                 vector<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_>
                 ::end(this->spans);
    bVar1 = __gnu_cxx::operator!=(&local_40,&local_50);
    if (!bVar1) break;
    pSVar6 = __gnu_cxx::
             __normal_iterator<const_twitter::zipkin::thrift::Span_*,_std::vector<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_>_>
             ::operator*(&local_40);
    iVar3 = (**(code **)(*(long *)pSVar6 + 0x18))(pSVar6,prot);
    tracker.prot_._4_4_ = iVar3 + tracker.prot_._4_4_;
    __gnu_cxx::
    __normal_iterator<const_twitter::zipkin::thrift::Span_*,_std::vector<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_>_>
    ::operator++(&local_40);
  }
  uVar2 = apache::thrift::protocol::TProtocol::writeListEnd(prot);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar2;
  uVar2 = apache::thrift::protocol::TProtocol::writeFieldEnd(prot);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar2;
  uVar2 = apache::thrift::protocol::TProtocol::writeFieldStop(prot);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar2;
  uVar2 = apache::thrift::protocol::TProtocol::writeStructEnd(prot);
  uVar4 = uVar2 + tracker.prot_._4_4_;
  tracker.prot_._4_4_ = uVar4;
  apache::thrift::protocol::TOutputRecursionTracker::~TOutputRecursionTracker(&local_28);
  return (ulong)uVar4;
}

Assistant:

uint32_t ZipkinCollector_submitZipkinBatch_pargs::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("ZipkinCollector_submitZipkinBatch_pargs");

  xfer += oprot->writeFieldBegin("spans", ::apache::thrift::protocol::T_LIST, 1);
  {
    xfer += oprot->writeListBegin(::apache::thrift::protocol::T_STRUCT, static_cast<uint32_t>((*(this->spans)).size()));
    std::vector<Span> ::const_iterator _iter29;
    for (_iter29 = (*(this->spans)).begin(); _iter29 != (*(this->spans)).end(); ++_iter29)
    {
      xfer += (*_iter29).write(oprot);
    }
    xfer += oprot->writeListEnd();
  }
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}